

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnData::SelectVector
          (ColumnData *this,ColumnScanState *state,Vector *result,idx_t target_count,
          SelectionVector *sel,idx_t sel_count)

{
  ColumnSegment *pCVar1;
  InternalException *this_00;
  idx_t iVar2;
  idx_t iVar3;
  ColumnFetchState fetch_state;
  undefined1 local_80 [32];
  float local_60;
  size_t local_58;
  __node_base_ptr p_Stack_50;
  vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  local_48;
  
  BeginScanVectorInternal(this,state);
  if (target_count <=
      ((state->current->super_SegmentBase<duckdb::ColumnSegment>).count.
       super___atomic_base<unsigned_long>._M_i +
      (state->current->super_SegmentBase<duckdb::ColumnSegment>).start) - state->row_index) {
    if (((state->scan_options).ptr == (TableScanOptions *)0x0) ||
       (optional_ptr<duckdb::TableScanOptions,_true>::CheckValid(&state->scan_options),
       ((state->scan_options).ptr)->force_fetch_row != true)) {
      ColumnSegment::Select(state->current,state,target_count,result,sel,sel_count);
    }
    else if (sel_count != 0) {
      iVar3 = 0;
      do {
        iVar2 = iVar3;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar2 = (idx_t)sel->sel_vector[iVar3];
        }
        local_80._8_8_ = 1;
        local_80._16_8_ = (_Hash_node_base *)0x0;
        local_80._24_8_ = 0;
        local_60 = 1.0;
        local_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58 = 0;
        p_Stack_50 = (__node_base_ptr)0x0;
        local_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pCVar1 = state->current;
        local_80._0_8_ = &p_Stack_50;
        (*((pCVar1->function)._M_data)->fetch_row)
                  (pCVar1,(ColumnFetchState *)local_80,
                   (iVar2 + state->row_index) -
                   (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).start,result,iVar3);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ::~vector(&local_48);
        ::std::
        _Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_80);
        iVar3 = iVar3 + 1;
      } while (sel_count != iVar3);
    }
    iVar3 = target_count + state->row_index;
    state->row_index = iVar3;
    state->internal_index = iVar3;
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_80._0_8_ = local_80 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,
             "ColumnData::SelectVector should be able to fetch everything from one segment","");
  InternalException::InternalException(this_00,(string *)local_80);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnData::SelectVector(ColumnScanState &state, Vector &result, idx_t target_count, const SelectionVector &sel,
                              idx_t sel_count) {
	BeginScanVectorInternal(state);
	if (state.current->start + state.current->count - state.row_index < target_count) {
		throw InternalException("ColumnData::SelectVector should be able to fetch everything from one segment");
	}
	if (state.scan_options && state.scan_options->force_fetch_row) {
		for (idx_t i = 0; i < sel_count; i++) {
			auto source_idx = sel.get_index(i);
			ColumnFetchState fetch_state;
			state.current->FetchRow(fetch_state, UnsafeNumericCast<row_t>(state.row_index + source_idx), result, i);
		}
	} else {
		state.current->Select(state, target_count, result, sel, sel_count);
	}
	state.row_index += target_count;
	state.internal_index = state.row_index;
}